

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O3

IceTCommunicator icetCreateMPICommunicator(MPI_Comm mpi_comm)

{
  IceTCommunicator __ptr;
  void *pvVar1;
  int line;
  
  __ptr = (IceTCommunicator)malloc(0x80);
  if (__ptr == (IceTCommunicator)0x0) {
    line = 0xba;
  }
  else {
    __ptr->Duplicate = Duplicate;
    __ptr->Destroy = Destroy;
    __ptr->Barrier = Barrier;
    __ptr->Send = Send;
    __ptr->Recv = Recv;
    __ptr->Sendrecv = Sendrecv;
    __ptr->Gather = Gather;
    __ptr->Gatherv = Gatherv;
    __ptr->Allgather = Allgather;
    __ptr->Isend = Isend;
    __ptr->Irecv = Irecv;
    __ptr->Wait = Waitone;
    __ptr->Waitany = Waitany;
    __ptr->Comm_size = Comm_size;
    __ptr->Comm_rank = Comm_rank;
    pvVar1 = malloc(8);
    __ptr->data = pvVar1;
    if (pvVar1 != (void *)0x0) {
      MPI_Comm_dup(mpi_comm,pvVar1);
      return __ptr;
    }
    free(__ptr);
    line = 0xd2;
  }
  icetRaiseDiagnostic("Could not allocate memory for IceTCommunicator.",0xfffffffc,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                      ,line);
  return (IceTCommunicator)0x0;
}

Assistant:

IceTCommunicator icetCreateMPICommunicator(MPI_Comm mpi_comm)
{
    IceTCommunicator comm = malloc(sizeof(struct IceTCommunicatorStruct));
#ifdef BREAK_ON_MPI_ERROR
    MPI_Errhandler eh;
#endif

    if (comm == NULL) {
        icetRaiseError("Could not allocate memory for IceTCommunicator.",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    comm->Duplicate = Duplicate;
    comm->Destroy = Destroy;
    comm->Barrier = Barrier;
    comm->Send = Send;
    comm->Recv = Recv;
    comm->Sendrecv = Sendrecv;
    comm->Gather = Gather;
    comm->Gatherv = Gatherv;
    comm->Allgather = Allgather;
    comm->Isend = Isend;
    comm->Irecv = Irecv;
    comm->Wait = Waitone;
    comm->Waitany = Waitany;
    comm->Comm_size = Comm_size;
    comm->Comm_rank = Comm_rank;

    comm->data = malloc(sizeof(MPI_Comm));
    if (comm->data == NULL) {
        free(comm);
        icetRaiseError("Could not allocate memory for IceTCommunicator.",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }
    MPI_Comm_dup(mpi_comm, (MPI_Comm *)comm->data);

#ifdef BREAK_ON_MPI_ERROR
    MPI_Errhandler_create(ErrorHandler, &eh);
    MPI_Errhandler_set(*((MPI_Comm *)comm->data), eh);
    MPI_Errhandler_free(&eh);
#endif

    return comm;
}